

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailCallTable
          (ParseFunctionGenerator *this,Printer *p)

{
  cpp *this_00;
  TailCallTableInfo *pTVar1;
  pointer puVar2;
  pointer puVar3;
  long *plVar4;
  Printer **ppPVar5;
  Printer *pPVar6;
  bool bVar7;
  size_type in_RCX;
  SkipEntryBlock *block;
  long lVar8;
  Span<const_google::protobuf::FieldDescriptor_*const> field_descriptors;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
  v;
  NumToEntryTable field_num_to_entry_table;
  anon_class_16_2_fd512ddd_for_cb_conflict2 GenerateAuxEntries;
  anon_class_1_0_00000001 local_9e9;
  undefined1 *local_9e8;
  undefined8 local_9e0;
  undefined1 local_9d8;
  undefined7 uStack_9d7;
  undefined8 uStack_9d0;
  undefined1 *local_9c8;
  undefined8 local_9c0;
  undefined1 local_9b8;
  undefined7 uStack_9b7;
  undefined8 uStack_9b0;
  undefined1 *local_9a8;
  undefined8 local_9a0;
  undefined1 local_998;
  undefined7 uStack_997;
  undefined8 uStack_990;
  undefined1 *local_988;
  undefined8 local_980;
  undefined1 local_978;
  undefined7 uStack_977;
  undefined8 uStack_970;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
  local_968;
  undefined1 *local_958;
  undefined8 local_950;
  undefined1 local_948;
  undefined7 uStack_947;
  undefined8 uStack_940;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  undefined1 local_8b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8a8;
  string local_898;
  Printer *local_878 [2];
  int local_868;
  int local_864;
  undefined1 local_860 [8];
  vector<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
  local_858;
  ParseFunctionGenerator *local_840;
  Printer **local_838;
  unsigned_long local_830;
  unsigned_long local_828;
  char *local_820;
  Sub local_818;
  Sub local_760;
  Sub local_6a8;
  Sub local_5f0;
  Sub local_538;
  Sub local_480;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  long *local_3a8;
  undefined8 uStack_3a0;
  code *local_398;
  code *local_390;
  undefined1 local_388;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370 [16];
  undefined1 local_360;
  undefined1 local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  long *local_2f0;
  undefined8 uStack_2e8;
  code *local_2e0;
  code *local_2d8;
  undefined1 local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  long *local_238;
  undefined8 uStack_230;
  code *local_228;
  code *local_220;
  undefined1 local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  undefined8 *local_180;
  undefined8 uStack_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  long *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  local_878[1] = p;
  io::Printer::
  WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>&,void,void>
            (&local_968,p,&this->variables_);
  this_00 = (cpp *)(this->ordered_fields_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  field_descriptors.ptr_ =
       (pointer)((long)(this->ordered_fields_).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3);
  field_descriptors.len_ = in_RCX;
  MakeNumToEntryTable((NumToEntryTable *)local_860,this_00,field_descriptors);
  pPVar6 = local_878[1];
  ppPVar5 = local_878 + 1;
  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
  local_840 = this;
  local_838 = ppPVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"const","");
  bVar7 = IsFileDescriptorProto(this->descriptor_->file_,this->options_);
  local_820 = "PROTOBUF_CONSTINIT PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\nconst";
  if (bVar7) {
    local_820 = "constexpr";
  }
  io::Printer::Sub::Sub<char_const*>(&local_818,&local_898,&local_820);
  local_8b8._0_8_ = &local_8a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8b8,"table_size_log2","");
  io::Printer::Sub::Sub<int&>
            (&local_760,(string *)local_8b8,
             &((this->tc_table_info_)._M_t.
               super___uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::internal::TailCallTableInfo_*,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
               .super__Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false>.
              _M_head_impl)->table_size_log2);
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d8,"ordered_size","");
  local_828 = (long)(this->ordered_fields_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->ordered_fields_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
  io::Printer::Sub::Sub<unsigned_long>(&local_6a8,&local_8d8,&local_828);
  local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f8,"aux_size","");
  pTVar1 = (this->tc_table_info_)._M_t.
           super___uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::internal::TailCallTableInfo_*,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           .super__Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false>.
           _M_head_impl;
  local_830 = (long)(pTVar1->aux_entries).
                    super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              *(long *)&(pTVar1->aux_entries).
                        super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                        ._M_impl >> 4;
  io::Printer::Sub::Sub<unsigned_long>(&local_5f0,&local_8f8,&local_830);
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"data_size","");
  pTVar1 = (this->tc_table_info_)._M_t.
           super___uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::internal::TailCallTableInfo_*,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           .super__Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false>.
           _M_head_impl;
  puVar2 = *(pointer *)
            &(pTVar1->field_name_data).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
  puVar3 = (pTVar1->field_name_data).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_864 = 0;
  if (puVar3 != puVar2) {
    local_864 = ((int)puVar3 - (int)puVar2) + 1;
  }
  io::Printer::Sub::Sub<int>(&local_538,&local_918,&local_864);
  local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_938,"field_num_to_entry_table_size","");
  local_868 = 2;
  for (; local_858.
         super__Vector_base<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_858.
         super__Vector_base<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      local_858.
      super__Vector_base<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_858.
           super__Vector_base<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    local_868 = local_868 +
                ((uint)((ulong)((long)((local_858.
                                        super__Vector_base<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->entries).
                                      super__Vector_base<google::protobuf::compiler::cpp::SkipEntry16,_std::allocator<google::protobuf::compiler::cpp::SkipEntry16>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)((local_858.
                                       super__Vector_base<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->entries).
                                     super__Vector_base<google::protobuf::compiler::cpp::SkipEntry16,_std::allocator<google::protobuf::compiler::cpp::SkipEntry16>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 1) & 0xfffffffe)
                + 3;
  }
  io::Printer::Sub::Sub<int>(&local_480,&local_938,&local_868);
  local_988 = &local_978;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"table_base","");
  local_3c8 = local_3b8;
  if (local_988 == &local_978) {
    uStack_3b0 = uStack_970;
  }
  else {
    local_3c8 = local_988;
  }
  local_878[0] = pPVar6;
  local_3c0 = local_980;
  local_980 = 0;
  local_978 = 0;
  local_988 = &local_978;
  local_3a8 = (long *)operator_new(0x20);
  *local_3a8 = (long)ppPVar5;
  local_3a8[1] = (long)this;
  local_3a8[2] = (long)local_860;
  *(undefined1 *)(local_3a8 + 3) = 0;
  local_390 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_3a0 = 0;
  local_398 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_388 = 1;
  local_380 = local_370;
  local_378 = 0;
  local_370[0] = 0;
  local_360 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_380,0,(char *)0x0,0x53a374);
  local_318 = 0;
  local_9a8 = &local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a8,"fast_entries","");
  local_310 = local_300;
  if (local_9a8 == &local_998) {
    uStack_2f8 = uStack_990;
  }
  else {
    local_310 = local_9a8;
  }
  local_308 = local_9a0;
  local_9a0 = 0;
  local_998 = 0;
  local_9a8 = &local_998;
  local_2f0 = (long *)operator_new(0x18);
  *local_2f0 = (long)ppPVar5;
  local_2f0[1] = (long)this;
  *(undefined1 *)(local_2f0 + 2) = 0;
  local_2d8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_2e8 = 0;
  local_2e0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_2d0 = 1;
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_2a8 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_2c8,0,(char *)0x0,0x53a374);
  local_260 = 0;
  local_9c8 = &local_9b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c8,"field_lookup_table","");
  local_258 = local_248;
  if (local_9c8 == &local_9b8) {
    uStack_240 = uStack_9b0;
  }
  else {
    local_258 = local_9c8;
  }
  local_250 = local_9c0;
  local_9c0 = 0;
  local_9b8 = 0;
  local_9c8 = &local_9b8;
  local_238 = (long *)operator_new(0x18);
  *local_238 = (long)local_860;
  local_238[1] = (long)ppPVar5;
  *(undefined1 *)(local_238 + 2) = 0;
  local_220 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_230 = 0;
  local_228 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_218 = 1;
  local_210 = local_200;
  local_208 = 0;
  local_200[0] = 0;
  local_1f0 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_210,0,(char *)0x0,0x53a374);
  local_1a8 = 0;
  local_9e8 = &local_9d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e8,"field_and_aux_entries","");
  local_1a0 = local_190;
  if (local_9e8 == &local_9d8) {
    uStack_188 = uStack_9d0;
  }
  else {
    local_1a0 = local_9e8;
  }
  local_198 = local_9e0;
  local_9e0 = 0;
  local_9d8 = 0;
  local_9e8 = &local_9d8;
  local_180 = (undefined8 *)operator_new(0x20);
  *local_180 = this;
  local_180[1] = ppPVar5;
  local_180[2] = &local_840;
  *(undefined1 *)(local_180 + 3) = 0;
  local_168 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_178 = 0;
  local_170 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_160 = 1;
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x53a374);
  local_f0 = 0;
  local_958 = &local_948;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_958,"field_names","");
  local_e8 = local_d8;
  if (local_958 == &local_948) {
    uStack_d0 = uStack_940;
  }
  else {
    local_e8 = local_958;
  }
  local_e0 = local_950;
  local_950 = 0;
  local_948 = 0;
  local_958 = &local_948;
  local_c8 = (long *)operator_new(0x18);
  *local_c8 = (long)ppPVar5;
  local_c8[1] = (long)this;
  *(undefined1 *)(local_c8 + 2) = 0;
  local_b0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  uStack_c0 = 0;
  local_b8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_a8 = 1;
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x53a374);
  local_38 = 0;
  io::Printer::Emit(local_878[0],&local_818,0xb,0x126,
                    "\n$const$ ::_pbi::TcParseTable<$table_size_log2$, $ordered_size$, $aux_size$, $data_size$, $field_num_to_entry_table_size$>\n$classname$::_table_ = {\n  {\n    $table_base$\n  }, {{\n    $fast_entries$\n  }}, {{\n    $field_lookup_table$\n  }}, $field_and_aux_entries$,\n  {{\n    $field_names$,\n  }},\n};\n"
                   );
  lVar8 = 0x7e8;
  do {
    if (*(char *)((long)&local_820 + lVar8) == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_860 + lVar8));
    }
    plVar4 = *(long **)((long)&local_898.field_2 + lVar8);
    if ((long *)((long)local_878 + lVar8) != plVar4) {
      operator_delete(plVar4,*(long *)((long)local_878 + lVar8) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[*(byte *)((long)&local_898._M_string_length + lVar8)]._M_data)
              (&local_9e9,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_8b8 + lVar8 + 8));
    *(undefined1 *)((long)&local_898._M_string_length + lVar8) = 0xff;
    if ((long *)(local_8b8 + lVar8 + -8) != *(long **)(local_8b8 + lVar8 + -0x18)) {
      operator_delete(*(long **)(local_8b8 + lVar8 + -0x18),*(long *)(local_8b8 + lVar8 + -8) + 1);
    }
    lVar8 = lVar8 + -0xb8;
  } while (lVar8 != 0);
  if (local_958 != &local_948) {
    operator_delete(local_958,CONCAT71(uStack_947,local_948) + 1);
  }
  if (local_9e8 != &local_9d8) {
    operator_delete(local_9e8,CONCAT71(uStack_9d7,local_9d8) + 1);
  }
  if (local_9c8 != &local_9b8) {
    operator_delete(local_9c8,CONCAT71(uStack_9b7,local_9b8) + 1);
  }
  if (local_9a8 != &local_998) {
    operator_delete(local_9a8,CONCAT71(uStack_997,local_998) + 1);
  }
  if (local_988 != &local_978) {
    operator_delete(local_988,CONCAT71(uStack_977,local_978) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_938._M_dataplus._M_p != &local_938.field_2) {
    operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
    operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._0_8_ != &local_8a8) {
    operator_delete((void *)local_8b8._0_8_,local_8a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
  ::~vector(&local_858);
  if (local_968.storage_.is_callback_engaged_ == true) {
    std::
    vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
    ::pop_back((vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                *)((long)local_968.storage_.callback_buffer_ + 0x98));
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateTailCallTable(io::Printer* p) {
  auto v = p->WithVars(variables_);
  // For simplicity and speed, the table is not covering all proto
  // configurations. This model uses a fallback to cover all situations that
  // the table can't accommodate, together with unknown fields or extensions.
  // These are number of fields over 32, fields with 3 or more tag bytes,
  // maps, weak fields, lazy, more than 1 extension range. In the cases
  // the table is sufficient we can use a generic routine, that just handles
  // unknown fields and potentially an extension range.
  NumToEntryTable field_num_to_entry_table =
      MakeNumToEntryTable(ordered_fields_);

  auto GenerateTableBase = [&] {
    p->Emit(
        {{"has_bits_offset",
          [&] {
            if (num_hasbits_ > 0 || IsMapEntryMessage(descriptor_)) {
              p->Emit(
                  "PROTOBUF_FIELD_OFFSET($classname$, _impl_._has_bits_),\n");
            } else {
              p->Emit("0,  // no _has_bits_\n");
            }
          }},
         {"extension_offset",
          [&] {
            if (descriptor_->extension_range_count() != 0) {
              p->Emit("PROTOBUF_FIELD_OFFSET($classname$, $extensions$),\n");
            } else {
              p->Emit("0, // no _extensions_\n");
            }
          }},
         {"max_field_number",
          ordered_fields_.empty() ? 0 : ordered_fields_.back()->number()},
         {"fast_idx_mask", (((1 << tc_table_info_->table_size_log2) - 1) << 3)},
         {"skipmap32", field_num_to_entry_table.skipmap32},
         {"field_entries_offset",
          [&] {
            if (ordered_fields_.empty()) {
              p->Emit(R"cc(
                offsetof(decltype(_table_), field_names),  // no field_entries
              )cc");
            } else {
              p->Emit(R"cc(
                offsetof(decltype(_table_), field_entries),
              )cc");
            }
          }},
         {"num_field_entries", ordered_fields_.size()},
         {"num_aux_entries", tc_table_info_->aux_entries.size()},
         {"aux_offset",
          [&] {
            if (tc_table_info_->aux_entries.empty()) {
              p->Emit(R"cc(
                offsetof(decltype(_table_), field_names),  // no aux_entries
              )cc");
            } else {
              p->Emit(R"cc(
                offsetof(decltype(_table_), aux_entries),
              )cc");
            }
          }},
         {"class_data", [&] { p->Emit("$classname$_class_data_.base(),\n"); }},
         {"post_loop_handler",
          [&] {
            if (NeedsPostLoopHandler(descriptor_, options_)) {
              p->Emit("&$classname$::PostLoopHandler,\n");
            } else {
              p->Emit("nullptr,  // post_loop_handler\n");
            }
          }},
         {"fallback", TcParseFunctionName(tc_table_info_->fallback_function)},
         {"to_prefetch",
          [&] {
            std::vector<const FieldDescriptor*> subtable_fields;
            for (const auto& aux : tc_table_info_->aux_entries) {
              if (aux.type == internal::TailCallTableInfo::kSubTable) {
                subtable_fields.push_back(aux.field);
              }
            }
            const auto* hottest = FindHottestField(subtable_fields, options_);
            p->Emit(
                {{"hot_type", QualifiedClassName(hottest == nullptr
                                                     ? descriptor_
                                                     : hottest->message_type(),
                                                 options_)}},
                R"cc(
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
                  ::_pbi::TcParser::GetTable<$hot_type$>(),  // to_prefetch
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE)cc");
          }}},
        // clang-format off
        R"cc(
        $has_bits_offset$,
        $extension_offset$,
        $max_field_number$, $fast_idx_mask$,  // max_field_number, fast_idx_mask
        offsetof(decltype(_table_), field_lookup_table),
        $skipmap32$,  // skipmap
        $field_entries_offset$,
        $num_field_entries$,  // num_field_entries
        $num_aux_entries$,  // num_aux_entries
        $aux_offset$,
        $class_data$,
        $post_loop_handler$,
        $fallback$,  // fallback
        $to_prefetch$)cc"
        // clang-format on
    );
  };

  auto GenerateAuxEntries = [&] {
    for (const auto& aux_entry : tc_table_info_->aux_entries) {
      switch (aux_entry.type) {
        case TailCallTableInfo::kNothing:
          p->Emit("{},\n");
          break;
        case TailCallTableInfo::kInlinedStringDonatedOffset:
          p->Emit(
              "{_fl::Offset{offsetof($classname$, "
              "_impl_._inlined_string_donated_)}},\n");
          break;
        case TailCallTableInfo::kSplitOffset:
          p->Emit("{_fl::Offset{offsetof($classname$, _impl_._split_)}},\n");
          break;
        case TailCallTableInfo::kSplitSizeof:
          p->Emit("{_fl::Offset{sizeof($classname$::Impl_::Split)}},\n");
          break;
        case TailCallTableInfo::kSubMessage:
          p->Emit({{"name", QualifiedDefaultInstanceName(
                                aux_entry.field->message_type(), options_)}},
                  "{::_pbi::FieldAuxDefaultMessage{}, &$name$},\n");
          break;
        case TailCallTableInfo::kSubTable:
          p->Emit({{"name", QualifiedClassName(aux_entry.field->message_type(),
                                               options_)}},
                  "{::_pbi::TcParser::GetTable<$name$>()},\n");
          break;
        case TailCallTableInfo::kSubMessageWeak:
          p->Emit({{"ptr", QualifiedDefaultInstancePtr(
                               aux_entry.field->message_type(), options_)}},
                  "{::_pbi::FieldAuxDefaultMessage{}, &$ptr$},\n");
          break;
        case TailCallTableInfo::kMessageVerifyFunc:
          p->Emit({{"name", QualifiedClassName(aux_entry.field->message_type(),
                                               options_)}},
                  "{$name$::InternalVerify},\n");
          break;
        case TailCallTableInfo::kSelfVerifyFunc:
          if (ShouldVerify(descriptor_, options_, scc_analyzer_)) {
            p->Emit("{&InternalVerify},\n");
          } else {
            p->Emit("{},\n");
          }
          break;
        case TailCallTableInfo::kEnumRange:
          p->Emit(
              {
                  {"first", aux_entry.enum_range.first},
                  {"last", aux_entry.enum_range.last},
              },
              "{$first$, $last$},\n");
          break;
        case TailCallTableInfo::kEnumValidator:
          p->Emit({{"name", QualifiedClassName(aux_entry.field->enum_type(),
                                               options_)}},
                  "{::_pbi::FieldAuxEnumData{}, $name$_internal_data_},\n");
          break;
        case TailCallTableInfo::kNumericOffset:
          p->Emit(
              {
                  {"offset", aux_entry.offset},
              },
              "{_fl::Offset{$offset$}},\n");
          break;
        case TailCallTableInfo::kMapAuxInfo: {
          auto utf8_check = internal::cpp::GetUtf8CheckMode(
              aux_entry.field,
              GetOptimizeFor(aux_entry.field->file(), options_) ==
                  FileOptions::LITE_RUNTIME);
          auto* map_key = aux_entry.field->message_type()->map_key();
          auto* map_value = aux_entry.field->message_type()->map_value();
          const bool validated_enum =
              map_value->type() == FieldDescriptor::TYPE_ENUM &&
              !internal::cpp::HasPreservingUnknownEnumSemantics(map_value);
          p->Emit(
              {
                  {"strict", utf8_check == Utf8CheckMode::kStrict},
                  {"verify", utf8_check == Utf8CheckMode::kVerify},
                  {"validate", validated_enum},
                  {"key_wire", map_key->type()},
                  {"value_wire", map_value->type()},
                  {"is_lite",
                   !HasDescriptorMethods(aux_entry.field->file(), options_)},
              },
              R"cc(
                {::_pbi::TcParser::GetMapAuxInfo($strict$, $verify$, $validate$,
                                                 $key_wire$, $value_wire$,
                                                 $is_lite$)},
              )cc");
          break;
        }
      }
    }
  };

  p->Emit(
      {{"const",
        // FileDescriptorProto's table must be constant initialized. For MSVC
        // this means using `constexpr`. However, we can't use `constexpr`
        // for all tables because it breaks when crossing DLL boundaries.
        // FileDescriptorProto is safe from this.
        IsFileDescriptorProto(descriptor_->file(), options_)
            ? "constexpr"
            : "PROTOBUF_CONSTINIT PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\nconst"},
       {"table_size_log2", tc_table_info_->table_size_log2},
       {"ordered_size", ordered_fields_.size()},
       {"aux_size", tc_table_info_->aux_entries.size()},
       {"data_size", FieldNameDataSize(tc_table_info_->field_name_data)},
       {"field_num_to_entry_table_size", field_num_to_entry_table.size16()},
       {"table_base", GenerateTableBase},
       {"fast_entries",
        [&] {
          // TODO: refactor this to use Emit.
          Formatter format(p, variables_);
          GenerateFastFieldEntries(format);
        }},
       {"field_lookup_table",
        [&] {
          for (SkipEntryBlock& entry_block : field_num_to_entry_table.blocks) {
            p->Emit(
                {
                    {"lower", entry_block.first_fnum & 65535},
                    {"upper", entry_block.first_fnum / 65536},
                    {"size", entry_block.entries.size()},
                },
                "$lower$, $upper$, $size$,\n");

            for (SkipEntry16 se16 : entry_block.entries) {
              p->Emit({{"skipmap", se16.skipmap},
                       {"offset", se16.field_entry_offset}},
                      R"cc(
                        $skipmap$, $offset$,
                      )cc");
            }
          }

          // The last entry of the skipmap are all 1's.
          p->Emit("65535, 65535\n");
        }},
       {"field_and_aux_entries",
        [&] {
          if (ordered_fields_.empty() &&
              !descriptor_->options().message_set_wire_format()) {
            ABSL_DLOG_IF(FATAL, !tc_table_info_->aux_entries.empty())
                << "Invalid message: " << descriptor_->full_name() << " has "
                << tc_table_info_->aux_entries.size()
                << " auxiliary field entries, but no fields";
            p->Emit("// no field_entries, or aux_entries\n");
            return;
          }

          p->Emit(
              {
                  {"field_entries",
                   [&] {
                     // TODO: refactor this to use Emit.
                     Formatter format(p, variables_);
                     GenerateFieldEntries(format);
                   }},
                  {"aux_entries",
                   [&] {
                     if (tc_table_info_->aux_entries.empty()) {
                       p->Emit("// no aux_entries\n");
                     } else {
                       p->Emit(
                           {
                               {"aux_entries_list", GenerateAuxEntries},
                           },
                           // clang-format off
                              R"cc(
                                {{
                                    $aux_entries_list$
                                }},
                              )cc"
                           // clang-format on
                       );
                     }
                   }},
              },
              // clang-format off
                 R"cc(
                 {{
                   $field_entries$,
                 }},
                 $aux_entries$)cc"
              // clang-format on
          );
        }},
       {"field_names",
        [&] {
          Formatter format(p, variables_);
          GenerateFieldNames(format);
        }}},
      // Disable clang-format, as we want to generate a denser table
      // representation than what clang-format typically wants. clang would
      // insert a newline at every brace, whereas we prefer {{ ... }} here.
      // clang-format off
R"cc(
$const$ ::_pbi::TcParseTable<$table_size_log2$, $ordered_size$, $aux_size$, $data_size$, $field_num_to_entry_table_size$>
$classname$::_table_ = {
  {
    $table_base$
  }, {{
    $fast_entries$
  }}, {{
    $field_lookup_table$
  }}, $field_and_aux_entries$,
  {{
    $field_names$,
  }},
};
)cc"
      // clang-format on
  );
}